

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::SourcePackage::SourcePackage(SourcePackage *this,SourcePackage *rhs)

{
  byte_t *value;
  UL local_48;
  SourcePackage *local_18;
  SourcePackage *rhs_local;
  SourcePackage *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  GenericPackage::GenericPackage
            (&this->super_GenericPackage,(rhs->super_GenericPackage).super_InterchangeObject.m_Dict)
  ;
  (this->super_GenericPackage).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__SourcePackage_00339f98;
  Kumu::UUID::UUID(&this->Descriptor);
  if ((this->super_GenericPackage).super_InterchangeObject.m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_GenericPackage).super_InterchangeObject.m_Dict,
                           MDD_SourcePackage);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_GenericPackage).super_InterchangeObject.super_KLVPacket.m_UL,
                  &local_48);
    UL::~UL(&local_48);
    (*(this->super_GenericPackage).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket[0x14])
              (this,local_18);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x282,"ASDCP::MXF::SourcePackage::SourcePackage(const SourcePackage &)");
}

Assistant:

SourcePackage::SourcePackage(const SourcePackage& rhs) : GenericPackage(rhs.m_Dict)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_SourcePackage);
  Copy(rhs);
}